

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O3

void av1_calc_proj_params_high_bd_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar9;
  undefined1 auVar8 [16];
  long lVar10;
  undefined1 in_XMM1 [16];
  long lVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar19;
  int iVar20;
  undefined1 in_XMM3 [16];
  undefined1 auVar17 [16];
  int iVar21;
  undefined1 auVar18 [16];
  long lVar22;
  undefined1 auVar23 [16];
  long lVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    if (height < 1) {
      auVar28 = (undefined1  [16])0x0;
      lVar4 = 0;
      lVar5 = 0;
    }
    else {
      lVar22 = (long)src8 * 2;
      lVar7 = (long)dat8 * 2;
      lVar4 = 0;
      lVar5 = 0;
      uVar3 = 0;
      auVar28 = (undefined1  [16])0x0;
      do {
        if (0 < width) {
          lVar9 = 0;
          do {
            auVar26 = pmovzxwd(in_XMM3,*(undefined8 *)(lVar7 + lVar9 * 2));
            auVar17 = pmovzxwd(in_XMM1,*(undefined8 *)(lVar22 + lVar9 * 2));
            piVar1 = flt1 + lVar9;
            auVar24._0_4_ = *piVar1 + auVar26._0_4_ * -0x10;
            auVar24._4_4_ = piVar1[1] + auVar26._4_4_ * -0x10;
            auVar24._8_4_ = piVar1[2] + auVar26._8_4_ * -0x10;
            auVar24._12_4_ = piVar1[3] + auVar26._12_4_ * -0x10;
            auVar31._0_4_ = (auVar17._0_4_ - auVar26._0_4_) * 0x10;
            auVar31._4_4_ = (auVar17._4_4_ - auVar26._4_4_) * 0x10;
            auVar31._8_4_ = (auVar17._8_4_ - auVar26._8_4_) * 0x10;
            auVar31._12_4_ = (auVar17._12_4_ - auVar26._12_4_) * 0x10;
            auVar17 = pmuldq(auVar24,auVar24);
            in_XMM3._0_8_ = auVar17._0_8_ + lVar4;
            in_XMM3._8_8_ = auVar17._8_8_ + lVar5;
            auVar17._4_4_ = auVar24._4_4_;
            auVar17._0_4_ = auVar24._4_4_;
            auVar17._8_4_ = auVar24._12_4_;
            auVar17._12_4_ = auVar24._12_4_;
            auVar24 = pmuldq(auVar24,auVar31);
            auVar26._4_4_ = 0;
            auVar26._0_4_ = auVar31._4_4_;
            auVar26._8_8_ = auVar31._8_8_ >> 0x20;
            auVar31 = pmuldq(auVar26,auVar17);
            auVar17 = pmuldq(auVar17,auVar17);
            lVar4 = auVar17._0_8_ + in_XMM3._0_8_;
            lVar5 = auVar17._8_8_ + in_XMM3._8_8_;
            in_XMM1._0_8_ = auVar31._0_8_ + auVar24._0_8_ + auVar28._0_8_;
            in_XMM1._8_8_ = auVar31._8_8_ + auVar24._8_8_ + auVar28._8_8_;
            lVar9 = lVar9 + 4;
            auVar28 = in_XMM1;
          } while (lVar9 < width);
        }
        uVar3 = uVar3 + 1;
        flt1 = flt1 + flt1_stride;
        lVar22 = lVar22 + (long)src_stride * 2;
        lVar7 = lVar7 + (long)dat_stride * 2;
        in_XMM1 = auVar28;
      } while (uVar3 != (uint)height);
    }
    *C = 0;
    C[1] = auVar28._8_8_ + auVar28._0_8_;
    H[1][0] = 0;
    H[1][1] = lVar5 + lVar4;
    lVar22 = (long)(height * width);
    H[1][1] = (lVar5 + lVar4) / lVar22;
  }
  else {
    lVar4 = (long)src8 * 2;
    lVar5 = (long)dat8 * 2;
    if (params->r[1] < 1) {
      if (height < 1) {
        auVar28 = (undefined1  [16])0x0;
        lVar7 = 0;
        lVar9 = 0;
      }
      else {
        lVar7 = 0;
        lVar9 = 0;
        uVar3 = 0;
        auVar28 = (undefined1  [16])0x0;
        do {
          if (0 < width) {
            lVar22 = 0;
            do {
              auVar31 = pmovzxwd(in_XMM3,*(undefined8 *)(lVar5 + lVar22 * 2));
              auVar17 = pmovzxwd(in_XMM1,*(undefined8 *)(lVar4 + lVar22 * 2));
              piVar1 = flt0 + lVar22;
              auVar25._0_4_ = *piVar1 + auVar31._0_4_ * -0x10;
              auVar25._4_4_ = piVar1[1] + auVar31._4_4_ * -0x10;
              auVar25._8_4_ = piVar1[2] + auVar31._8_4_ * -0x10;
              auVar25._12_4_ = piVar1[3] + auVar31._12_4_ * -0x10;
              auVar11._0_4_ = (auVar17._0_4_ - auVar31._0_4_) * 0x10;
              auVar11._4_4_ = (auVar17._4_4_ - auVar31._4_4_) * 0x10;
              auVar11._8_4_ = (auVar17._8_4_ - auVar31._8_4_) * 0x10;
              auVar11._12_4_ = (auVar17._12_4_ - auVar31._12_4_) * 0x10;
              auVar17 = pmuldq(auVar25,auVar25);
              in_XMM3._0_8_ = auVar17._0_8_ + lVar7;
              in_XMM3._8_8_ = auVar17._8_8_ + lVar9;
              auVar8._4_4_ = auVar25._4_4_;
              auVar8._0_4_ = auVar25._4_4_;
              auVar8._8_4_ = auVar25._12_4_;
              auVar8._12_4_ = auVar25._12_4_;
              auVar26 = pmuldq(auVar25,auVar11);
              auVar12._4_4_ = 0;
              auVar12._0_4_ = auVar11._4_4_;
              auVar12._8_8_ = auVar11._8_8_ >> 0x20;
              auVar31 = pmuldq(auVar12,auVar8);
              auVar17 = pmuldq(auVar8,auVar8);
              lVar7 = auVar17._0_8_ + in_XMM3._0_8_;
              lVar9 = auVar17._8_8_ + in_XMM3._8_8_;
              in_XMM1._0_8_ = auVar31._0_8_ + auVar26._0_8_ + auVar28._0_8_;
              in_XMM1._8_8_ = auVar31._8_8_ + auVar26._8_8_ + auVar28._8_8_;
              lVar22 = lVar22 + 4;
              auVar28 = in_XMM1;
            } while (lVar22 < width);
          }
          uVar3 = uVar3 + 1;
          flt0 = flt0 + flt0_stride;
          lVar4 = lVar4 + (long)src_stride * 2;
          lVar5 = lVar5 + (long)dat_stride * 2;
          in_XMM1 = auVar28;
        } while (uVar3 != (uint)height);
      }
      *C = auVar28._8_8_ + auVar28._0_8_;
      C[1] = 0;
      (*H)[0] = lVar9 + lVar7;
      (*H)[1] = 0;
      lVar22 = (long)(height * width);
      (*H)[0] = (lVar9 + lVar7) / lVar22;
      goto LAB_0042efc1;
    }
    if (height < 1) {
      lVar22 = 0;
      lVar27 = 0;
      auVar28 = (undefined1  [16])0x0;
      lVar7 = 0;
      lVar9 = 0;
      lVar14 = 0;
      lVar15 = 0;
      lVar10 = 0;
      lVar13 = 0;
    }
    else {
      lVar10 = 0;
      lVar13 = 0;
      uVar3 = 0;
      lVar14 = 0;
      lVar15 = 0;
      lVar7 = 0;
      lVar9 = 0;
      auVar28 = (undefined1  [16])0x0;
      lVar22 = 0;
      lVar27 = 0;
      do {
        if (0 < width) {
          lVar6 = 0;
          do {
            auVar17 = pmovzxwd(in_XMM3,*(undefined8 *)(lVar5 + lVar6 * 2));
            auVar31 = pmovzxwd(in_XMM8,*(undefined8 *)(lVar4 + lVar6 * 2));
            piVar1 = flt0 + lVar6;
            piVar2 = flt1 + lVar6;
            iVar16 = auVar17._0_4_;
            iVar19 = auVar17._4_4_;
            iVar20 = auVar17._8_4_;
            iVar21 = auVar17._12_4_;
            in_XMM8._0_4_ = (auVar31._0_4_ - iVar16) * 0x10;
            in_XMM8._4_4_ = (auVar31._4_4_ - iVar19) * 0x10;
            in_XMM8._8_4_ = (auVar31._8_4_ - iVar20) * 0x10;
            in_XMM8._12_4_ = (auVar31._12_4_ - iVar21) * 0x10;
            auVar32._0_4_ = *piVar1 + iVar16 * -0x10;
            auVar32._4_4_ = piVar1[1] + iVar19 * -0x10;
            auVar32._8_4_ = piVar1[2] + iVar20 * -0x10;
            auVar32._12_4_ = piVar1[3] + iVar21 * -0x10;
            auVar30._0_4_ = *piVar2 + iVar16 * -0x10;
            auVar30._4_4_ = piVar2[1] + iVar19 * -0x10;
            auVar30._8_4_ = piVar2[2] + iVar20 * -0x10;
            auVar30._12_4_ = piVar2[3] + iVar21 * -0x10;
            auVar31 = pmuldq(auVar32,auVar32);
            auVar18._4_4_ = auVar32._4_4_;
            auVar18._0_4_ = auVar32._4_4_;
            auVar18._8_4_ = auVar32._12_4_;
            auVar18._12_4_ = auVar32._12_4_;
            auVar17 = pmuldq(auVar18,auVar18);
            lVar10 = auVar17._0_8_ + auVar31._0_8_ + lVar10;
            lVar13 = auVar17._8_8_ + auVar31._8_8_ + lVar13;
            auVar31 = pmuldq(auVar30,auVar32);
            auVar23._4_4_ = auVar30._4_4_;
            auVar23._0_4_ = auVar30._4_4_;
            auVar23._8_4_ = auVar30._12_4_;
            auVar23._12_4_ = auVar30._12_4_;
            auVar17 = pmuldq(auVar23,auVar18);
            lVar14 = auVar17._0_8_ + auVar31._0_8_ + lVar14;
            lVar15 = auVar17._8_8_ + auVar31._8_8_ + lVar15;
            auVar31 = pmuldq(auVar30,auVar30);
            auVar17 = pmuldq(auVar23,auVar23);
            lVar7 = auVar17._0_8_ + auVar31._0_8_ + lVar7;
            lVar9 = auVar17._8_8_ + auVar31._8_8_ + lVar9;
            auVar31 = pmuldq(auVar32,in_XMM8);
            auVar29._4_4_ = in_XMM8._4_4_;
            auVar29._0_4_ = in_XMM8._4_4_;
            auVar29._8_4_ = in_XMM8._12_4_;
            auVar29._12_4_ = in_XMM8._12_4_;
            auVar17 = pmuldq(auVar18,auVar29);
            in_XMM3._0_8_ = auVar17._0_8_ + auVar31._0_8_ + auVar28._0_8_;
            in_XMM3._8_8_ = auVar17._8_8_ + auVar31._8_8_ + auVar28._8_8_;
            auVar17 = pmuldq(auVar30,in_XMM8);
            auVar28 = pmuldq(auVar23,auVar29);
            lVar22 = auVar28._0_8_ + auVar17._0_8_ + lVar22;
            lVar27 = auVar28._8_8_ + auVar17._8_8_ + lVar27;
            lVar6 = lVar6 + 4;
            auVar28 = in_XMM3;
          } while (lVar6 < width);
        }
        uVar3 = uVar3 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar4 = lVar4 + (long)src_stride * 2;
        lVar5 = lVar5 + (long)dat_stride * 2;
        in_XMM3 = auVar28;
      } while (uVar3 != (uint)height);
    }
    *C = auVar28._8_8_ + auVar28._0_8_;
    C[1] = lVar27 + lVar22;
    lVar22 = (long)(height * width);
    (*H)[0] = (lVar13 + lVar10) / lVar22;
    lVar4 = (lVar15 + lVar14) / lVar22;
    (*H)[1] = lVar4;
    H[1][1] = (lVar9 + lVar7) / lVar22;
    H[1][0] = lVar4;
    *C = *C / lVar22;
  }
  C = C + 1;
LAB_0042efc1:
  *C = *C / lVar22;
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_sse4_1(const uint8_t *src8, int width,
                                         int height, int src_stride,
                                         const uint8_t *dat8, int dat_stride,
                                         int32_t *flt0, int flt0_stride,
                                         int32_t *flt1, int flt1_stride,
                                         int64_t H[2][2], int64_t C[2],
                                         const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                          dat_stride, flt0, flt0_stride, flt1,
                                          flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                       dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                       dat_stride, flt1, flt1_stride, H, C);
  }
}